

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext *ctx,ExprArraySetup *node)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  LLVMValueRef pLVar3;
  TypeBase *valueType;
  
  pTVar1 = node->lhs->type;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x62c,
                  "LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext &, ExprArraySetup *)");
  }
  pp_Var2 = pTVar1[1]._vptr_TypeBase;
  if ((pp_Var2 != (_func_int **)0x0) && (*(int *)(pp_Var2 + 1) == 0x13)) {
    pLVar3 = CompileLlvm(ctx,node->initializer);
    pTVar1 = node->initializer->type;
    valueType = GetStackType(ctx,pTVar1);
    ConvertToDataType(ctx,pLVar3,valueType,pTVar1);
    CompileLlvm(ctx,node->lhs);
    CompileLlvmType(ctx,ctx->ctx->typeInt);
    CompileLlvmType(ctx,ctx->ctx->typeInt);
    if ((long)(int)(*(long *)(pp_Var2[0xc] + 0x30) * (long)pp_Var2[0xd]) ==
        *(long *)(pp_Var2[0xc] + 0x30) * (long)pp_Var2[0xd]) {
      CompileLlvmType(ctx,ctx->ctx->typeInt);
      CompileLlvmType(ctx,ctx->ctx->typeInt);
      pLVar3 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
      return pLVar3;
    }
    __assert_fail("int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x645,
                  "LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext &, ExprArraySetup *)");
  }
  __assert_fail("arrayType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x630,
                "LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext &, ExprArraySetup *)");
}

Assistant:

LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext &ctx, ExprArraySetup *node)
{
	TypeRef *refType = getType<TypeRef>(node->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	LLVMValueRef initializer = CompileLlvm(ctx, node->initializer);

	initializer = ConvertToDataType(ctx, initializer, GetStackType(ctx, node->initializer->type), node->initializer->type);

	LLVMValueRef address = CompileLlvm(ctx, node->lhs);

	LLVMValueRef offsetPtr = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, ctx.ctx.typeInt), "arr_it");

	LLVMBasicBlockRef conditionBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "arr_setup_cond");
	LLVMBasicBlockRef bodyBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "arr_setup_body");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "arr_setup_exit");

	LLVMBuildStore(ctx.builder, LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 0, true), offsetPtr);

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, conditionBlock);

	// Offset will move in element size steps, so it will reach the full size of the array
	assert(int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size);

	// While offset is less than array size
	LLVMValueRef condition = LLVMBuildICmp(ctx.builder, LLVMIntSLT, LLVMBuildLoad(ctx.builder, offsetPtr, ""), LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), int(arrayType->length), true), "");

	LLVMBuildCondBr(ctx.builder, condition, bodyBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, bodyBlock);

	LLVMValueRef offset = LLVMBuildLoad(ctx.builder, offsetPtr, "");

	LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), offset };

	LLVMBuildStore(ctx.builder, initializer, LLVMBuildGEP(ctx.builder, address, indices, 2, ""));
	LLVMBuildStore(ctx.builder, LLVMBuildAdd(ctx.builder, offset, LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 1, true), ""), offsetPtr);

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	return CheckType(ctx, node, NULL);
}